

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::imul_extended_invalid_lsb
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  ShaderFunction function;
  bool bVar1;
  char *__s;
  long *plVar2;
  size_type *psVar3;
  long lVar4;
  string shaderSource;
  allocator<char> local_c1;
  long local_c0;
  string local_b8;
  string local_98;
  long local_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  shaderSource._M_dataplus._M_p = (pointer)&shaderSource.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&shaderSource,"imulExtended: Invalid lsb type.","");
  NegativeTestContext::beginSection(ctx,&shaderSource);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderSource._M_dataplus._M_p != &shaderSource.field_2) {
    operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1);
  }
  lVar4 = 0;
  do {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar4];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_c1);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1cbc003);
      shaderSource._M_dataplus._M_p = (pointer)&shaderSource.field_2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)*plVar2 == psVar3) {
        shaderSource.field_2._M_allocated_capacity = *psVar3;
        shaderSource.field_2._8_8_ = plVar2[3];
      }
      else {
        shaderSource.field_2._M_allocated_capacity = *psVar3;
        shaderSource._M_dataplus._M_p = (pointer)*plVar2;
      }
      shaderSource._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      NegativeTestContext::beginSection(ctx,&shaderSource);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shaderSource._M_dataplus._M_p != &shaderSource.field_2) {
        operator_delete(shaderSource._M_dataplus._M_p,shaderSource.field_2._M_allocated_capacity + 1
                       );
      }
      local_78 = lVar4;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      lVar4 = 0;
      do {
        function = deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes[lVar4];
        local_c0 = lVar4;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceMulExtended_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_LAST|SHADERTYPE_FRAGMENT,
                   function,function,function,
                   deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes[lVar4],
                   (DataType)shaderSource._M_dataplus._M_p);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,shaderSource._M_dataplus._M_p,
                   shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
        verifyShader(ctx,shaderType,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shaderSource._M_dataplus._M_p != &shaderSource.field_2) {
          operator_delete(shaderSource._M_dataplus._M_p,
                          shaderSource.field_2._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceMulExtended_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_LAST|SHADERTYPE_FRAGMENT,
                   function,function,function,
                   deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes[local_c0],
                   (DataType)shaderSource._M_dataplus._M_p);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,shaderSource._M_dataplus._M_p,
                   shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
        verifyShader(ctx,shaderType,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shaderSource._M_dataplus._M_p != &shaderSource.field_2) {
          operator_delete(shaderSource._M_dataplus._M_p,
                          shaderSource.field_2._M_allocated_capacity + 1);
        }
        lVar4 = 0;
        do {
          if (*(ShaderFunction *)
               ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes + lVar4) !=
              function) {
            NegativeTestShared::(anonymous_namespace)::genShaderSourceMulExtended_abi_cxx11_
                      (&shaderSource,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_LAST|SHADERTYPE_FRAGMENT,
                       function,function,function,
                       *(ShaderFunction *)
                        ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes +
                        lVar4),(DataType)shaderSource._M_dataplus._M_p);
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,shaderSource._M_dataplus._M_p,
                       shaderSource._M_dataplus._M_p + shaderSource._M_string_length);
            verifyShader(ctx,shaderType,&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)shaderSource._M_dataplus._M_p != &shaderSource.field_2) {
              operator_delete(shaderSource._M_dataplus._M_p,
                              shaderSource.field_2._M_allocated_capacity + 1);
            }
          }
          lVar4 = lVar4 + 4;
        } while (lVar4 != 0x10);
        lVar4 = local_c0 + 1;
      } while (lVar4 != 4);
      NegativeTestContext::endSection(ctx);
      lVar4 = local_78;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void imul_extended_invalid_lsb (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));

	ctx.beginSection("imulExtended: Invalid lsb type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_intTypes); ++dataTypeNdx)
			{
				{
					const std::string shaderSource(genShaderSourceMulExtended(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_IMUL_EXTENDED, s_intTypes[dataTypeNdx], s_intTypes[dataTypeNdx], s_intTypes[dataTypeNdx], s_floatTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceMulExtended(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_IMUL_EXTENDED, s_intTypes[dataTypeNdx], s_intTypes[dataTypeNdx], s_intTypes[dataTypeNdx], s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				for (int dataTypeNdx2 = 0; dataTypeNdx2 < DE_LENGTH_OF_ARRAY(s_intTypes); ++dataTypeNdx2)
				{
					if (s_intTypes[dataTypeNdx2] == s_intTypes[dataTypeNdx])
						continue;

					const std::string shaderSource(genShaderSourceMulExtended(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_IMUL_EXTENDED, s_intTypes[dataTypeNdx], s_intTypes[dataTypeNdx], s_intTypes[dataTypeNdx], s_intTypes[dataTypeNdx2]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}